

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_cepstrum_to_mlsa_digital_filter_coefficients.cc
# Opt level: O1

bool __thiscall
sptk::MelCepstrumToMlsaDigitalFilterCoefficients::Run
          (MelCepstrumToMlsaDigitalFilterCoefficients *this,
          vector<double,_std::allocator<double>_> *mel_cepstrum,
          vector<double,_std::allocator<double>_> *mlsa_digital_filter_coefficients)

{
  pointer __src;
  pointer pdVar1;
  long lVar2;
  size_t __n;
  bool bVar3;
  size_type __new_size;
  double dVar4;
  
  if (this->is_valid_ == true) {
    bVar3 = false;
    if ((mlsa_digital_filter_coefficients != (vector<double,_std::allocator<double>_> *)0x0) &&
       (__new_size = (long)this->num_order_ + 1, bVar3 = false,
       (long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == __new_size)) {
      if ((long)(mlsa_digital_filter_coefficients->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_finish -
          (long)(mlsa_digital_filter_coefficients->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize
                  (mlsa_digital_filter_coefficients,__new_size);
      }
      __src = (mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
      if ((this->alpha_ != 0.0) || (NAN(this->alpha_))) {
        pdVar1 = (mlsa_digital_filter_coefficients->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar2 = (long)this->num_order_;
        pdVar1[lVar2] = __src[lVar2];
        bVar3 = true;
        if (0 < lVar2) {
          dVar4 = pdVar1[lVar2];
          lVar2 = lVar2 + 1;
          do {
            dVar4 = __src[lVar2 + -2] - dVar4 * this->alpha_;
            pdVar1[lVar2 + -2] = dVar4;
            lVar2 = lVar2 + -1;
          } while (1 < lVar2);
        }
      }
      else {
        bVar3 = true;
        __n = (long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src;
        if (__n != 0) {
          memmove((mlsa_digital_filter_coefficients->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,__src,__n);
        }
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool MelCepstrumToMlsaDigitalFilterCoefficients::Run(
    const std::vector<double>& mel_cepstrum,
    std::vector<double>* mlsa_digital_filter_coefficients) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ || mel_cepstrum.size() != static_cast<std::size_t>(length) ||
      NULL == mlsa_digital_filter_coefficients) {
    return false;
  }

  // Prepare memories.
  if (mlsa_digital_filter_coefficients->size() !=
      static_cast<std::size_t>(length)) {
    mlsa_digital_filter_coefficients->resize(length);
  }

  // There is no need to convert input when alpha is zero.
  if (0.0 == alpha_) {
    std::copy(mel_cepstrum.begin(), mel_cepstrum.end(),
              mlsa_digital_filter_coefficients->begin());
    return true;
  }

  const double* c(&(mel_cepstrum[0]));
  double* b(&((*mlsa_digital_filter_coefficients)[0]));

  // Apply recursive formula.
  b[num_order_] = c[num_order_];
  for (int m(num_order_ - 1); 0 <= m; --m) {
    b[m] = c[m] - alpha_ * b[m + 1];
  }

  return true;
}